

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cornellbox.cpp
# Opt level: O3

void __thiscall CornellBox::CornellBox(CornellBox *this)

{
  tmat4x4<float> Result_2;
  tmat4x4<float> Result_1;
  tmat4x4<float> Result;
  ColorRGB local_170;
  undefined1 local_160 [12];
  col_type cStack_154;
  anon_union_16_3_e2189aaa_for_tvec4<float>_1 aStack_140;
  anon_union_16_3_e2189aaa_for_tvec4<float>_1 aStack_130;
  undefined1 local_120 [12];
  col_type cStack_114;
  undefined1 auStack_100 [12];
  col_type local_f4;
  undefined4 local_e4;
  undefined1 local_e0 [12];
  col_type cStack_d4;
  anon_union_16_3_e2189aaa_for_tvec4<float>_1 aStack_c0;
  anon_union_16_3_e2189aaa_for_tvec4<float>_1 aStack_b0;
  tmat4x4<float> local_a0;
  mat4 local_60;
  
  local_e0._0_4_ = 1.0;
  local_e0._4_8_ = 0;
  cStack_d4.field_0._0_8_ = 0;
  cStack_d4.field_0.field_0.z = 1.0;
  stack0xffffffffffffff38 = 0;
  aStack_c0._0_8_ = 0;
  aStack_c0._8_8_ = 0x3f800000;
  aStack_b0._0_8_ = 0;
  aStack_b0._8_8_ = 0x3f800000c2200000;
  local_120._0_4_ = 20.0;
  local_120._4_8_ = 0;
  cStack_114.field_0._0_8_ = 0;
  cStack_114.field_0.field_0.z = 20.0;
  stack0xfffffffffffffef8 = 0;
  auStack_100._0_8_ = 0;
  auStack_100._8_4_ = 20.0;
  local_f4.field_0._0_8_ = 0;
  local_f4.field_0._8_8_ = 0;
  local_e4 = 1.0;
  glm::detail::operator*((tmat4x4<float> *)local_e0,(tmat4x4<float> *)local_120);
  local_160._0_4_ = 1.0;
  local_160._4_8_ = 0;
  cStack_154.field_0._0_8_ = 0;
  cStack_154.field_0.field_0.z = 1.0;
  stack0xfffffffffffffeb8 = 0;
  aStack_140._0_8_ = 0;
  aStack_140._8_8_ = 0x3f800000;
  aStack_130._0_8_ = 0xbf000000bf000000;
  aStack_130._8_8_ = 0x3f8000003f000000;
  glm::detail::operator*(&local_a0,(tmat4x4<float> *)local_160);
  ColorRGB::ColorRGB(&local_170);
  SceneObject::SceneObject(&this->super_SceneObject,&local_60,local_170);
  (this->super_SceneObject)._vptr_SceneObject = (_func_int **)&PTR__CornellBox_0010bcc8;
  memset(&this->triangles,0,0xa8);
  _calculateGeometry(this);
  return;
}

Assistant:

CornellBox::CornellBox() : 
    SceneObject(
        glm::translate<float>(0, 0, -40) *
        glm::scale<float>(20, 20, 20) *
        glm::translate<float>(-0.5, -0.5, 0.5),
        ColorRGB()) {
    _calculateGeometry();
}